

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::RandomSSBOLayoutCase
          (RandomSSBOLayoutCase *this,Context *context,char *name,char *description,
          BufferMode bufferMode,deUint32 features,deUint32 seed)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  int iVar1;
  deUint32 features_local;
  BufferMode bufferMode_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  RandomSSBOLayoutCase *this_local;
  
  testCtx = gles31::Context::getTestContext(context);
  renderCtx = gles31::Context::getRenderContext(context);
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,renderCtx,name,description,GLSL_VERSION_310_ES,
             bufferMode);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RandomSSBOLayoutCase_032c2338;
  this->m_features = features;
  this->m_maxBlocks = 4;
  iVar1 = 0;
  if ((features & 0x20) != 0) {
    iVar1 = 3;
  }
  this->m_maxInstances = iVar1;
  iVar1 = 0;
  if ((features & 4) != 0) {
    iVar1 = 8;
  }
  this->m_maxArrayLength = iVar1;
  iVar1 = 0;
  if ((features & 8) != 0) {
    iVar1 = 2;
  }
  this->m_maxStructDepth = iVar1;
  this->m_maxBlockMembers = 5;
  this->m_maxStructMembers = 4;
  this->m_seed = seed;
  this->m_blockNdx = 1;
  this->m_bufferVarNdx = 1;
  this->m_structNdx = 1;
  return;
}

Assistant:

RandomSSBOLayoutCase::RandomSSBOLayoutCase (Context& context, const char* name, const char* description, BufferMode bufferMode, deUint32 features, deUint32 seed)
	: SSBOLayoutCase		(context.getTestContext(), context.getRenderContext(), name, description, glu::GLSL_VERSION_310_ES, bufferMode)
	, m_features			(features)
	, m_maxBlocks			(4)
	, m_maxInstances		((features & FEATURE_INSTANCE_ARRAYS)	? 3 : 0)
	, m_maxArrayLength		((features & FEATURE_ARRAYS)			? 8 : 0)
	, m_maxStructDepth		((features & FEATURE_STRUCTS)			? 2 : 0)
	, m_maxBlockMembers		(5)
	, m_maxStructMembers	(4)
	, m_seed				(seed)
	, m_blockNdx			(1)
	, m_bufferVarNdx		(1)
	, m_structNdx			(1)
{
}